

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint8_t n;
  float x1;
  float c;
  float b;
  float a;
  float x2;
  uint8_t local_45;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_38 = 0.0;
  local_3c = 0.0;
  local_40 = 0.0;
  do {
    printf("Please enter the three quadratic arguments separated by a space: ");
    iVar1 = __isoc99_scanf("%f %f %f",&local_38,&local_3c,&local_40);
    if (iVar1 != 3) {
      if (iVar1 == -1) {
        putchar(10);
        return 0;
      }
      puts("Invalid input!");
      __isoc99_scanf("%*[^\n]");
    }
  } while (iVar1 < 3);
  printf("Equation: %fx^2%+fx%+f = 0\n",(double)local_38,(double)local_3c,(double)local_40);
  solve_quad(local_38,local_3c,local_40,&local_45,&local_44,&local_34);
  if (local_45 == '\x02') {
    printf("%f and %f are the two solutions to this equation.\n",(double)local_44,(double)local_34);
  }
  else if (local_45 == '\x01') {
    printf("%f is the only solution.\n",(double)local_44);
  }
  else if (local_45 == '\0') {
    puts("No solutions!");
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  float a = 0.0, b = 0.0, c = 0.0;
  int scanf_res = 0;
  while (scanf_res < 3) {
    printf("Please enter the three quadratic arguments separated by a space: ");
    scanf_res = scanf("%f %f %f", &a, &b, &c);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res != 3) {
      printf("Invalid input!\n");
      scanf("%*[^\n]");
    }
  }
  uint8_t n;
  float x1, x2;
  printf("Equation: %fx^2%+fx%+f = 0\n", a, b, c);
  solve_quad(a, b, c, &n, &x1, &x2);
  if (n == 0) {
    printf("No solutions!\n");
  } else if (n == 1) {
    printf("%f is the only solution.\n", x1);
  } else if (n == 2) {
    printf("%f and %f are the two solutions to this equation.\n", x1, x2);
  }

  // return 0;
}